

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O3

Client __thiscall capnp::TwoPartyClient::bootstrap(TwoPartyClient *this)

{
  Reader vatId_00;
  ClientHook *extraout_RDX;
  long in_RSI;
  Client CVar1;
  Builder vatId;
  MallocMessageBuilder message;
  Builder local_198;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  StructBuilder local_150;
  PointerBuilder local_128;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,4,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_198,&local_108.super_MessageBuilder);
  local_128.pointer = local_198.builder.pointer;
  local_128.segment = local_198.builder.segment;
  local_128.capTable = local_198.builder.capTable;
  capnp::_::PointerBuilder::getStruct(&local_150,&local_128,(StructSize)0x1,(word *)0x0);
  *(ushort *)local_150.data = (ushort)(*(short *)(in_RSI + 0x18) != 1);
  capnp::_::StructBuilder::asReader(&local_150);
  vatId_00._reader.capTable = (CapTableReader *)uStack_178;
  vatId_00._reader.segment = (SegmentReader *)local_180;
  vatId_00._reader.data = (void *)local_170;
  vatId_00._reader.pointers = (WirePointer *)uStack_168;
  vatId_00._reader.dataSize = (undefined4)local_160;
  vatId_00._reader.pointerCount = local_160._4_2_;
  vatId_00._reader._38_2_ = local_160._6_2_;
  vatId_00._reader._40_8_ = uStack_158;
  capnp::_::RpcSystemBase::baseBootstrap((RpcSystemBase *)this,vatId_00);
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  CVar1.hook.ptr = extraout_RDX;
  CVar1.hook.disposer = (Disposer *)this;
  return (Client)CVar1.hook;
}

Assistant:

Capability::Client TwoPartyClient::bootstrap() {
  MallocMessageBuilder message(4);
  auto vatId = message.getRoot<rpc::twoparty::VatId>();
  vatId.setSide(network.getSide() == rpc::twoparty::Side::CLIENT
                ? rpc::twoparty::Side::SERVER
                : rpc::twoparty::Side::CLIENT);
  return rpcSystem.bootstrap(vatId);
}